

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmemcache_test_mt.c
# Opt level: O1

void on_miss_cb(VMEMcache *cache,void *key,size_t key_size,void *arg)

{
  int iVar1;
  int *piVar2;
  long lVar3;
  void *extraout_RDX;
  os_thread_t *thread;
  uint uVar4;
  uint *puVar5;
  ulong uVar7;
  ulong uVar8;
  void *arg_00;
  os_thread_t *thread_00;
  undefined1 auStack_150 [264];
  long lStack_48;
  undefined8 uStack_40;
  undefined8 uVar6;
  
  puVar5 = *(uint **)((long)arg + 8);
  lVar3 = (*key % (ulong)*(uint *)((long)arg + 0x18)) * 0x10;
  iVar1 = vmemcache_put(puVar5,key,key_size,*(undefined8 *)(*(long *)((long)arg + 0x10) + 8 + lVar3)
                        ,*(undefined8 *)(*(long *)((long)arg + 0x10) + lVar3));
  if ((iVar1 != 0) && (piVar2 = __errno_location(), *piVar2 != 0x11)) {
    on_miss_cb_cold_1();
    uStack_40 = 0;
    if (puVar5[7] != 0) {
      uVar7 = 0;
      do {
        lStack_48 = ((ulong)*puVar5 << 0x30) + uVar7;
        uVar6 = *(undefined8 *)(puVar5 + 2);
        thread = (os_thread_t *)(auStack_150 + 0x108);
        lVar3 = vmemcache_get(uVar6,(os_thread_t *)(auStack_150 + 0x108),8,auStack_150,0x100,0,
                              &uStack_40);
        uVar4 = (uint)uVar6;
        if (lVar3 == -1) {
          worker_thread_get_unique_keys_cold_1();
          if (uVar4 != 0) {
            uVar8 = (ulong)uVar4;
            uVar7 = uVar8;
            arg_00 = extraout_RDX;
            thread_00 = thread;
            do {
              os_thread_create(thread_00,(os_thread_attr_t *)0x0,
                               *(_func_void_ptr_void_ptr **)((long)arg_00 + 0x20),arg_00);
              thread_00 = thread_00 + 1;
              arg_00 = (void *)((long)arg_00 + 0x28);
              uVar7 = uVar7 - 1;
            } while (uVar7 != 0);
            do {
              os_thread_join(thread,(void **)0x0);
              thread = thread + 1;
              uVar8 = uVar8 - 1;
            } while (uVar8 != 0);
          }
          return;
        }
        uVar7 = uVar7 + 1;
      } while (uVar7 < puVar5[7]);
    }
    return;
  }
  return;
}

Assistant:

static void
on_miss_cb(VMEMcache *cache, const void *key, size_t key_size, void *arg)
{
	struct context *ctx = arg;

	typedef unsigned long long key_t;
	assert(key_size == sizeof(key_t));

	key_t n = *(key_t *)key;

	int ret = vmemcache_put(ctx->cache, key, key_size,
				ctx->buffs[n % ctx->nbuffs].buff,
				ctx->buffs[n % ctx->nbuffs].size);
	if (ret && errno != EEXIST)
		UT_FATAL("ERROR: vmemcache_put: %s", vmemcache_errormsg());
}